

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O1

void perfetto::DataSource<perfetto::TrackEvent,_perfetto::internal::TrackEventDataSourceTraits>::
     CreateDataSourceCustomTLSImpl<perfetto::internal::TrackEventTlsState>
               (TraceContext *trace_context,TrackEventTlsState *param_2)

{
  DataSourceInstanceThreadLocalState *pDVar1;
  void *pvVar2;
  TrackEventTlsState *this;
  
  this = (TrackEventTlsState *)operator_new(0x18);
  internal::TrackEventTlsState::
  TrackEventTlsState<perfetto::DataSource<perfetto::TrackEvent,perfetto::internal::TrackEventDataSourceTraits>::TraceContext>
            (this,trace_context);
  pDVar1 = trace_context->tls_inst_;
  pvVar2 = (pDVar1->data_source_custom_tls)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
           _M_head_impl;
  (pDVar1->data_source_custom_tls)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>._M_head_impl
       = this;
  if (pvVar2 != (void *)0x0) {
    (*(_func_void_void_ptr *)
      (pDVar1->data_source_custom_tls)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
      super__Head_base<1UL,_void_(*)(void_*),_false>)();
  }
  (pDVar1->data_source_custom_tls)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false> =
       (_Head_base<1UL,_void_(*)(void_*),_false>)
       CreateDataSourceCustomTLSImpl<perfetto::internal::TrackEventTlsState>::
       anon_class_1_0_00000001::__invoke;
  return;
}

Assistant:

static void CreateDataSourceCustomTLSImpl(const TraceContext& trace_context,
                                            const T*) {
    PERFETTO_DCHECK(!trace_context.tls_inst_->data_source_custom_tls);
    trace_context.tls_inst_->data_source_custom_tls =
        internal::DataSourceInstanceThreadLocalState::ObjectWithDeleter(
            reinterpret_cast<void*>(new T(trace_context)),
            [](void* p) { delete reinterpret_cast<T*>(p); });
  }